

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O3

__pid_t __thiscall Fossilize::ExternalReplayer::Impl::wait(Impl *this,void *__stat_loc)

{
  __pid_t _Var1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  void *pvVar5;
  uint uVar6;
  bool bVar7;
  char dummy;
  int local_8c;
  Progress local_88;
  
  if (this->pid == -1) goto LAB_00183fe4;
  poll_progress(this,&local_88);
  uVar6 = this->child_fd;
  pvVar5 = (void *)(ulong)uVar6;
  if (-1 < (int)uVar6) {
    uVar2 = read(uVar6,&local_8c,1);
    if ((int)uVar2 < 0) {
      wait(pvVar5);
    }
    else if ((int)uVar2 != 0) {
      fprintf(_stderr,"Fossilize ERROR: Unexpected return for child process, %d.\n",
              uVar2 & 0xffffffff);
    }
    close(this->child_fd);
    this->child_fd = -1;
  }
  _Var1 = waitpid(this->pid,&this->wstatus,1);
  if (_Var1 == 0) {
    uVar6 = 0;
    do {
      usleep(1000);
      pvVar5 = (void *)(ulong)(uint)this->pid;
      _Var1 = waitpid(this->pid,&this->wstatus,1);
      if (_Var1 < 0) {
        piVar3 = __errno_location();
        local_8c = -*piVar3;
        goto LAB_00183fc8;
      }
    } while ((_Var1 == 0) && (bVar7 = uVar6 < 99, uVar6 = uVar6 + 1, bVar7));
    if (_Var1 == 0) {
      wait(pvVar5);
      local_8c = 0;
      goto LAB_00183fc8;
    }
  }
  else if (_Var1 < 0) {
    wait(&local_8c);
LAB_00183fc8:
    this->wstatus = local_8c;
    this->synthesized_exit_code = true;
  }
  poll_progress(this,&local_88);
  reset_pid(this);
LAB_00183fe4:
  uVar6 = this->wstatus;
  if (this->synthesized_exit_code == false) {
    uVar4 = uVar6 & 0x7f;
    if (uVar4 == 0) {
      uVar6 = uVar6 >> 8 & 0xff;
    }
    else {
      uVar6 = 0;
      if (0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) {
        uVar6 = -uVar4;
      }
    }
  }
  return uVar6;
}

Assistant:

int ExternalReplayer::Impl::wait()
{
	if (pid == -1)
		return wstatus_to_return(wstatus, synthesized_exit_code);

	// Pump the fifo through.
	ExternalReplayer::Progress progress = {};
	poll_progress(progress);

#if 0
	// FIXME: This code should be correct. Investigate why it seems to cause stability issues.
	for (;;)
	{
		if (waitpid(pid, &wstatus, 0) < 0)
		{
			LOGE("waitpid failed! errno = %d.\n", errno);
			wstatus = -errno;
			synthesized_exit_code = true;
			break;
		}

		// Child process can receive SIGCONT/SIGSTOP which is benign.
		if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus))
			break;
	}
#else
	// The normal approach here is to use waitpid and block until completion
	// but that approach appears to have some stability issues.
	// The theory is that a parent process might be calling waitpid(-1, NOWAIT) in a thread or signal handler
	// which could confuse things.
	// Instead, use child_fd as a canary for when the child process tree dies.
	if (child_fd >= 0)
	{
		char dummy;
		int r = ::read(child_fd, &dummy, sizeof(dummy));
		if (r < 0)
			LOGE("Failed to wait for child process to end.\n");
		else if (r > 0)
			LOGE("Unexpected return for child process, %d.\n", r);
		close(child_fd);
		child_fd = -1;
	}

	int r = waitpid(pid, &wstatus, WNOHANG);
	if (r == 0)
	{
		// There is a race between the last reference to child_fd being closed
		// and SIGCHLD being delivered.
		// Unfortunately, there is no robust way to poll for waitpid with a timeout
		// (outside of the very recent pidfd in Linux 5.x+),
		// so do it in a dumb way ... We should receive the wstatus shortly.
		for (int i = 0; i < 100 && r == 0; i++)
		{
			usleep(1000);
			r = waitpid(pid, &wstatus, WNOHANG);
			if (r < 0)
			{
				wstatus = -errno;
				synthesized_exit_code = true;
			}
		}

		if (r == 0)
		{
			LOGW("waitpid loop timed out.\n");
			wstatus = 0;
			synthesized_exit_code = true;
		}
	}
	else if (r < 0)
	{
		// Could happen if process has set SIG_IGN or NOCLDWAIT for SIGCHLD.
		LOGW("Child has already been reaped.\n");
		wstatus = -errno;
		synthesized_exit_code = true;
	}
#endif

	// Pump the fifo through.
	poll_progress(progress);
	reset_pid();
	return wstatus_to_return(wstatus, synthesized_exit_code);
}